

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

bool basisu::read_file_to_vec(char *pFilename,uint8_vec *data)

{
  FILE *__stream;
  size_t i;
  uchar *__ptr;
  size_t sVar1;
  undefined8 in_RSI;
  char *in_RDI;
  int64_t filesize;
  FILE *pFile;
  undefined1 grow_hint;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  grow_hint = (undefined1)((ulong)in_RSI >> 0x38);
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    bVar2 = false;
  }
  else {
    fseek(__stream,0,2);
    i = ftello(__stream);
    if ((long)i < 0) {
      fclose(__stream);
      bVar2 = false;
    }
    else {
      fseek(__stream,0,0);
      bVar2 = vector<unsigned_char>::try_resize
                        ((vector<unsigned_char> *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         (size_t)in_RDI,(bool)grow_hint);
      if (bVar2) {
        if (i != 0) {
          __ptr = vector<unsigned_char>::operator[]((vector<unsigned_char> *)__stream,i);
          sVar1 = fread(__ptr,1,i,__stream);
          if (sVar1 != i) {
            fclose(__stream);
            return false;
          }
        }
        fclose(__stream);
        bVar2 = true;
      }
      else {
        fclose(__stream);
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool read_file_to_vec(const char* pFilename, uint8_vec& data)
	{
		FILE* pFile = nullptr;
#ifdef _WIN32
		fopen_s(&pFile, pFilename, "rb");
#else
		pFile = fopen(pFilename, "rb");
#endif
		if (!pFile)
			return false;
				
		fseek(pFile, 0, SEEK_END);
#ifdef _WIN32
		int64_t filesize = _ftelli64(pFile);
#else
		int64_t filesize = ftello(pFile);
#endif
		if (filesize < 0)
		{
			fclose(pFile);
			return false;
		}
		fseek(pFile, 0, SEEK_SET);

		if (sizeof(size_t) == sizeof(uint32_t))
		{
			if (filesize > 0x70000000)
			{
				// File might be too big to load safely in one alloc
				fclose(pFile);
				return false;
			}
		}

		if (!data.try_resize((size_t)filesize))
		{
			fclose(pFile);
			return false;
		}

		if (filesize)
		{
			if (fread(&data[0], 1, (size_t)filesize, pFile) != (size_t)filesize)
			{
				fclose(pFile);
				return false;
			}
		}

		fclose(pFile);
		return true;
	}